

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

void __thiscall Inst::print(Inst *this,ostream *o)

{
  size_type sVar1;
  const_reference c;
  int local_20;
  int i;
  int n;
  ostream *o_local;
  Inst *this_local;
  
  operator<<(o,&this->tag_);
  std::operator<<(o,"(");
  sVar1 = std::vector<Arg,_std::allocator<Arg>_>::size(&this->args);
  for (local_20 = 0; local_20 < (int)sVar1; local_20 = local_20 + 1) {
    c = std::vector<Arg,_std::allocator<Arg>_>::operator[](&this->args,(long)local_20);
    operator<<(o,c);
    if (local_20 < (int)sVar1 + -1) {
      std::operator<<(o,",");
    }
  }
  std::operator<<(o,")");
  return;
}

Assistant:

void print(std::ostream &o) const  {
        o << tag_;
        o << "(";
        const int n = args.size();
        for(int i = 0; i < n; ++i) {
            o << args[i];
            if (i < n - 1) o << ",";
        }
        o << ")";
    }